

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

void __thiscall hmi::renderer::~renderer(renderer *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x20) != 0) {
    (*glad_glDeleteProgram)(*(GLuint *)(in_RDI + 0x20));
  }
  if (*(long *)(in_RDI + 8) != 0) {
    SDL_GL_DeleteContext(*(undefined8 *)(in_RDI + 8));
  }
  return;
}

Assistant:

renderer::~renderer() {
    // delete shader

    if (m_program != 0) {
      glDeleteProgram(m_program);
    }

    // delete context

    if (m_context != nullptr) {
      SDL_GL_DeleteContext(m_context);
    }
  }